

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_x86.h
# Opt level: O0

__m128i dc_sum_32_sse2(uint8_t *ref)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  longlong in_RDX;
  __m128i alVar3;
  __m128i high;
  __m128i zero;
  __m128i x1;
  __m128i x0;
  uint8_t *ref_local;
  
  alVar3[0] = (undefined1 (*) [16])(ref + 0x10);
  high[0] = SUB168(ZEXT816(0),4);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = high[0];
  auVar1 = vpsadbw_avx(*(undefined1 (*) [16])ref,auVar1 << 0x40);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = high[0];
  auVar2 = vpsadbw_avx(*alVar3[0],auVar2 << 0x40);
  auVar1 = vpaddw_avx(auVar1,auVar2);
  auVar2 = vpunpckhqdq_avx(auVar1,auVar1);
  vpaddw_avx(auVar1,auVar2);
  alVar3[1] = in_RDX;
  return alVar3;
}

Assistant:

static inline __m128i dc_sum_32_sse2(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x0 = _mm_add_epi16(x0, x1);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}